

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_io.cpp
# Opt level: O2

bool __thiscall ON_Brep::ReadOld101(ON_Brep *this,ON_BinaryArchive *file)

{
  ON_CurveProxy *this_00;
  ON_SurfaceProxy *this_01;
  ON_BrepVertex *pOVar1;
  ON_BrepEdge *pOVar2;
  ON_BrepTrim *pOVar3;
  ON_BrepLoop *pOVar4;
  ON_BrepFace *pOVar5;
  long lVar6;
  int iVar7;
  ON_Curve *pOVar8;
  ON_Surface *proxy_surface;
  long lVar9;
  long lVar10;
  int count;
  ON_Object *pO;
  ON_Curve *pC;
  ON_Surface *pS;
  int local_4c;
  ON_Object *local_48;
  ON_Curve *local_40;
  ON_Surface *local_38;
  
  local_48 = (ON_Object *)0x0;
  local_40 = (ON_Curve *)0x0;
  local_38 = (ON_Surface *)0x0;
  ON_BinaryArchive::ReadInt(file,&local_4c);
  ON_SimpleArray<ON_Curve_*>::Reserve(&(this->m_C2).super_ON_SimpleArray<ON_Curve_*>,(long)local_4c)
  ;
  for (iVar7 = 0; iVar7 < local_4c; iVar7 = iVar7 + 1) {
    local_48 = (ON_Object *)0x0;
    ON_BinaryArchive::ReadObject(file,&local_48);
    local_40 = ON_Curve::Cast(local_48);
    if ((local_40 == (ON_Curve *)0x0) && (local_48 != (ON_Object *)0x0)) {
      (*local_48->_vptr_ON_Object[4])();
    }
    ON_SimpleArray<ON_Curve_*>::Append(&(this->m_C2).super_ON_SimpleArray<ON_Curve_*>,&local_40);
    local_40 = (ON_Curve *)0x0;
    local_48 = (ON_Object *)0x0;
  }
  ON_BinaryArchive::ReadInt(file,&local_4c);
  ON_SimpleArray<ON_Curve_*>::Reserve(&(this->m_C3).super_ON_SimpleArray<ON_Curve_*>,(long)local_4c)
  ;
  for (iVar7 = 0; iVar7 < local_4c; iVar7 = iVar7 + 1) {
    local_48 = (ON_Object *)0x0;
    ON_BinaryArchive::ReadObject(file,&local_48);
    local_40 = ON_Curve::Cast(local_48);
    if ((local_40 == (ON_Curve *)0x0) && (local_48 != (ON_Object *)0x0)) {
      (*local_48->_vptr_ON_Object[4])();
    }
    ON_SimpleArray<ON_Curve_*>::Append(&(this->m_C3).super_ON_SimpleArray<ON_Curve_*>,&local_40);
    local_40 = (ON_Curve *)0x0;
    local_48 = (ON_Object *)0x0;
  }
  ON_BinaryArchive::ReadInt(file,&local_4c);
  ON_SimpleArray<ON_Surface_*>::Reserve
            (&(this->m_S).super_ON_SimpleArray<ON_Surface_*>,(long)local_4c);
  for (iVar7 = 0; iVar7 < local_4c; iVar7 = iVar7 + 1) {
    local_48 = (ON_Object *)0x0;
    ON_BinaryArchive::ReadObject(file,&local_48);
    local_38 = ON_Surface::Cast(local_48);
    if ((local_38 == (ON_Surface *)0x0) && (local_48 != (ON_Object *)0x0)) {
      (*local_48->_vptr_ON_Object[4])();
    }
    ON_SimpleArray<ON_Surface_*>::Append(&(this->m_S).super_ON_SimpleArray<ON_Surface_*>,&local_38);
    local_38 = (ON_Surface *)0x0;
    local_48 = (ON_Object *)0x0;
  }
  ON_BinaryArchive::ReadInt(file,&local_4c);
  ON_ClassArray<ON_BrepVertex>::Reserve((ON_ClassArray<ON_BrepVertex> *)&this->m_V,(long)local_4c);
  if ((-1 < local_4c) &&
     (local_4c <=
      (this->m_V).super_ON_ObjectArray<ON_BrepVertex>.super_ON_ClassArray<ON_BrepVertex>.m_capacity)
     ) {
    (this->m_V).super_ON_ObjectArray<ON_BrepVertex>.super_ON_ClassArray<ON_BrepVertex>.m_count =
         local_4c;
  }
  lVar10 = 0;
  for (lVar9 = 0; lVar9 < local_4c; lVar9 = lVar9 + 1) {
    pOVar1 = (this->m_V).super_ON_ObjectArray<ON_BrepVertex>.super_ON_ClassArray<ON_BrepVertex>.m_a;
    (**(code **)(*(long *)((long)&(pOVar1->super_ON_Point).super_ON_Geometry.super_ON_Object.
                                  _vptr_ON_Object + lVar10) + 0x58))
              ((long)&(pOVar1->super_ON_Point).super_ON_Geometry.super_ON_Object._vptr_ON_Object +
               lVar10,file);
    lVar10 = lVar10 + 0x58;
  }
  ON_BinaryArchive::ReadInt(file,&local_4c);
  ON_ClassArray<ON_BrepEdge>::Reserve((ON_ClassArray<ON_BrepEdge> *)&this->m_E,(long)local_4c);
  if ((-1 < local_4c) &&
     (local_4c <=
      (this->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.m_capacity)) {
    (this->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.m_count =
         local_4c;
  }
  lVar9 = 0;
  for (lVar10 = 0; lVar10 < local_4c; lVar10 = lVar10 + 1) {
    pOVar2 = (this->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.m_a;
    this_00 = (ON_CurveProxy *)
              ((long)&(((ON_CurveProxy *)(&(pOVar2->super_ON_CurveProxy).m_real_curve_domain + -2))
                      ->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object + lVar9);
    (**(code **)(*(long *)((long)&(((ON_CurveProxy *)
                                   (&(pOVar2->super_ON_CurveProxy).m_real_curve_domain + -2))->
                                  super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object
                          + lVar9) + 0x58))(this_00);
    lVar6 = (long)*(int *)((long)pOVar2->m_vi + lVar9 + -4);
    if (lVar6 < 0) {
      pOVar8 = (ON_Curve *)0x0;
    }
    else {
      pOVar8 = (this->m_C3).super_ON_SimpleArray<ON_Curve_*>.m_a[lVar6];
    }
    ON_CurveProxy::SetProxyCurve(this_00,pOVar8);
    *(ON_Brep **)((long)pOVar2->m_vi + lVar9 + 0x2c) = this;
    lVar9 = lVar9 + 0x88;
  }
  ON_BinaryArchive::ReadInt(file,&local_4c);
  ON_ClassArray<ON_BrepTrim>::Reserve((ON_ClassArray<ON_BrepTrim> *)&this->m_T,(long)local_4c);
  if ((-1 < local_4c) &&
     (local_4c <=
      (this->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.m_capacity)) {
    (this->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.m_count =
         local_4c;
  }
  lVar10 = 0;
  for (lVar9 = 0; lVar9 < local_4c; lVar9 = lVar9 + 1) {
    pOVar3 = (this->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.m_a;
    (**(code **)(*(long *)((long)&(((ON_CurveProxy *)
                                   (&(pOVar3->super_ON_CurveProxy).m_real_curve_domain + -2))->
                                  super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object
                          + lVar10) + 0x58))
              ((long)&(((ON_CurveProxy *)(&(pOVar3->super_ON_CurveProxy).m_real_curve_domain + -2))
                      ->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object + lVar10);
    pOVar3 = (this->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.m_a;
    lVar6 = (long)*(int *)((long)pOVar3->m_vi + lVar10 + -8);
    if (lVar6 < 0) {
      pOVar8 = (ON_Curve *)0x0;
    }
    else {
      pOVar8 = (this->m_C2).super_ON_SimpleArray<ON_Curve_*>.m_a[lVar6];
    }
    ON_CurveProxy::SetProxyCurve
              ((ON_CurveProxy *)
               ((long)&(((ON_CurveProxy *)(&(pOVar3->super_ON_CurveProxy).m_real_curve_domain + -2))
                       ->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object + lVar10)
               ,pOVar8);
    *(ON_Brep **)((long)pOVar3->m_tolerance + lVar10 + 0x70) = this;
    lVar10 = lVar10 + 0xe8;
  }
  ON_BinaryArchive::ReadInt(file,&local_4c);
  ON_ClassArray<ON_BrepLoop>::Reserve((ON_ClassArray<ON_BrepLoop> *)&this->m_L,(long)local_4c);
  if ((-1 < local_4c) &&
     (local_4c <=
      (this->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.m_capacity)) {
    (this->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.m_count =
         local_4c;
  }
  lVar10 = 0;
  for (lVar9 = 0; lVar9 < local_4c; lVar9 = lVar9 + 1) {
    pOVar4 = (this->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.m_a;
    (**(code **)(*(long *)((long)&(pOVar4->super_ON_Geometry).super_ON_Object._vptr_ON_Object +
                          lVar10) + 0x58))
              ((long)&(pOVar4->super_ON_Geometry).super_ON_Object._vptr_ON_Object + lVar10,file);
    *(ON_Brep **)
     ((long)&((this->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.m_a)->
             m_brep + lVar10) = this;
    lVar10 = lVar10 + 0x78;
  }
  ON_BinaryArchive::ReadInt(file,&local_4c);
  ON_ClassArray<ON_BrepFace>::Reserve((ON_ClassArray<ON_BrepFace> *)&this->m_F,(long)local_4c);
  if ((-1 < local_4c) &&
     (local_4c <=
      (this->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_capacity)) {
    (this->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_count =
         local_4c;
  }
  lVar9 = 0;
  for (lVar10 = 0; lVar10 < local_4c; lVar10 = lVar10 + 1) {
    pOVar5 = (this->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_a;
    this_01 = (ON_SurfaceProxy *)((pOVar5->m_face_uuid).Data4 + lVar9 + -0x5c);
    (**(code **)(*(long *)((pOVar5->m_face_uuid).Data4 + lVar9 + -0x5c) + 0x58))(this_01);
    lVar6 = (long)*(int *)((pOVar5->m_face_uuid).Data4 + lVar9 + -0x14);
    if (lVar6 < 0) {
      proxy_surface = (ON_Surface *)0x0;
    }
    else {
      proxy_surface = (this->m_S).super_ON_SimpleArray<ON_Surface_*>.m_a[lVar6];
    }
    ON_SurfaceProxy::SetProxySurface(this_01,proxy_surface);
    *(ON_Brep **)((long)(&pOVar5->m_face_uuid + 7) + lVar9 + 0xc) = this;
    lVar9 = lVar9 + 0xd8;
  }
  ON_BinaryArchive::ReadPoint(file,&(this->m_bbox).m_min);
  ON_BinaryArchive::ReadPoint(file,&(this->m_bbox).m_max);
  ReadFillInMissingBoxes(this);
  return true;
}

Assistant:

bool ON_Brep::ReadOld101( ON_BinaryArchive& file )
{
  ON_Object*  pO = nullptr;
  ON_Curve*   pC = nullptr;
  ON_Surface* pS = nullptr;
  int i, count;

  // 2d curves
  file.ReadInt( &count );
  m_C2.Reserve(count);
  for ( i = 0; i < count; i++ ) 
  {
    pO = nullptr;
    file.ReadObject( &pO );
    pC = ON_Curve::Cast(pO);
    if ( !pC )
      delete pO; // ERROR!
    m_C2.Append( pC );
    pC = nullptr;
    pO = nullptr;
  }

  // 3d curves
  file.ReadInt( &count );
  m_C3.Reserve(count);
  for ( i = 0; i < count; i++ ) 
  {
    pO = nullptr;
    file.ReadObject( &pO );
    pC = ON_Curve::Cast(pO);
    if ( !pC )
      delete pO; // ERROR!
    m_C3.Append( pC );
    pC = nullptr;
    pO = nullptr;
  }

  // untrimmed surfaces
  file.ReadInt( &count );
  m_S.Reserve(count);
  for ( i = 0; i < count; i++ ) 
  {
    pO = nullptr;
    file.ReadObject( &pO );
    pS = ON_Surface::Cast(pO);
    if ( !pS )
      delete pO; // ERROR!
    m_S.Append( pS );
    pS = nullptr;
    pO = nullptr;
  }

  // vertices
  file.ReadInt( &count );
  m_V.Reserve(count);
  m_V.SetCount(count);
  for ( i = 0; i < count; i++ ) 
  {
    m_V[i].Read(file);
  }

  // edges
  file.ReadInt( &count );
  m_E.Reserve(count);
  m_E.SetCount(count);
  for ( i = 0; i < count; i++ ) 
  {
    ON_BrepEdge& edge = m_E[i];
    edge.Read(file);
    edge.SetProxyCurve( edge.m_c3i >= 0 ? m_C3[edge.m_c3i] : 0 );
    edge.m_brep = this;
  }

  // trims
  file.ReadInt( &count );
  m_T.Reserve(count);
  m_T.SetCount(count);
  for ( i = 0; i < count; i++ ) 
  {
    m_T[i].Read(file);
    ON_BrepTrim& trim = m_T[i];
    trim.SetProxyCurve( trim.m_c2i >= 0 ? m_C2[trim.m_c2i] : 0 );
    trim.m_brep = this;
  }

  // loops
  file.ReadInt( &count );
  m_L.Reserve(count);
  m_L.SetCount(count);
  for ( i = 0; i < count; i++ ) 
  {
    m_L[i].Read(file);
    m_L[i].m_brep = this;
  }

  // faces
  file.ReadInt( &count );
  m_F.Reserve(count);
  m_F.SetCount(count);
  for ( i = 0; i < count; i++ ) 
  {
    ON_BrepFace& face = m_F[i];
    face.Read(file);
    face.SetProxySurface(face.m_si >= 0 ? m_S[face.m_si] : 0);
    face.m_brep = this;
  }

  // bounding box
  file.ReadPoint( m_bbox.m_min );
  file.ReadPoint( m_bbox.m_max );

  // fill in missing information
  ReadFillInMissingBoxes(*this);

  return true;
}